

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ensemble.cpp
# Opt level: O1

void __thiscall NPT::cmp(NPT *this)

{
  void *in_RDX;
  void *in_RSI;
  
  cmp((NPT *)((long)&this->_vptr_NPT + (long)this->_vptr_NPT[-5]),in_RSI,in_RDX);
  return;
}

Assistant:

uint NPT::cmp(const Ensemble& src) const {
  uint Qt = NVT::cmp(src);
  if(this == &src) { return Qt; }
  try {
    const NPT& _src = dynamic_cast<const NPT&>(src);
    Qt |= (this->P != _src.getP()) << DPressure;
    return Qt;
  } catch (const bad_cast& bcex) {
    return Qt;
  }
}